

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dinic.cpp
# Opt level: O1

void __thiscall Dinic::Dinic(Dinic *this,int _N)

{
  allocator_type local_2b;
  allocator_type local_2a;
  allocator_type local_29;
  
  this->n = _N;
  (this->e).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (this->e).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->e).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&this->g,(long)_N,&local_2b);
  std::vector<int,_std::allocator<int>_>::vector(&this->d,(long)this->n,&local_2a);
  std::vector<int,_std::allocator<int>_>::vector(&this->pt,(long)this->n,&local_29);
  return;
}

Assistant:

Dinic(int _N) : n(_N), g(n), d(n), pt(n) {}